

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O0

void __thiscall avro::json::JsonGenerator::objectStart(JsonGenerator *this)

{
  size_t in_RCX;
  void *__buf;
  JsonGenerator *in_RDI;
  value_type *in_stack_ffffffffffffffe8;
  
  sep(in_RDI);
  std::
  stack<avro::json::JsonGenerator::State,_std::deque<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>_>
  ::push((stack<avro::json::JsonGenerator::State,_std::deque<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>_>
          *)in_RDI,in_stack_ffffffffffffffe8);
  in_RDI->top = stMap0;
  StreamWriter::write(&in_RDI->out_,0x7b,__buf,in_RCX);
  return;
}

Assistant:

void objectStart() {
        sep();
        stateStack.push(top);
        top = stMap0;
        out_.write('{');
    }